

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O0

int ffppn(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,void *nulval,
         int *status)

{
  ULONGLONG *in_RCX;
  double in_RDX;
  int in_ESI;
  long in_RDI;
  ULONGLONG in_R8;
  long in_R9;
  long unaff_retaddr;
  long group;
  float nulval_00;
  uchar nulval_02;
  unsigned_short nulval_01;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(int *)group < 1) {
    nulval_00 = (float)((ulong)in_RDX >> 0x20);
    if (in_R9 == 0) {
      ffppr((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(int)nulval_00,(LONGLONG)in_RCX,
            in_R8,(void *)0x0,(int *)0x1);
      iVar1 = *(int *)group;
    }
    else {
      nulval_02 = (uchar)((ulong)in_RDX >> 0x38);
      if (in_ESI == 0xb) {
        ffppnb((fitsfile *)group,unaff_retaddr,
               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               (uchar *)CONCAT44(0xb,in_stack_ffffffffffffffe8),nulval_02,(int *)nelem);
      }
      else if (in_ESI == 0xc) {
        ffppnsb((fitsfile *)group,unaff_retaddr,
                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                (char *)CONCAT44(0xc,in_stack_ffffffffffffffe8),nulval_02,(int *)nelem);
      }
      else {
        nulval_01 = (unsigned_short)((ulong)in_RDX >> 0x30);
        if (in_ESI == 0x14) {
          ffppnui((fitsfile *)group,unaff_retaddr,
                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  (unsigned_short *)CONCAT44(0x14,in_stack_ffffffffffffffe8),nulval_01,(int *)nelem)
          ;
        }
        else if (in_ESI == 0x15) {
          ffppni((fitsfile *)group,unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (short *)CONCAT44(0x15,in_stack_ffffffffffffffe8),nulval_01,(int *)nelem);
        }
        else if (in_ESI == 0x1e) {
          ffppnuk((fitsfile *)group,unaff_retaddr,
                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  (uint *)CONCAT44(0x1e,in_stack_ffffffffffffffe8),(uint)nulval_00,(int *)nelem);
        }
        else if (in_ESI == 0x1f) {
          ffppnk((fitsfile *)group,unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (int *)CONCAT44(0x1f,in_stack_ffffffffffffffe8),(int)nulval_00,(int *)nelem);
        }
        else if (in_ESI == 0x28) {
          ffppnuj((fitsfile *)group,unaff_retaddr,
                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  (unsigned_long *)CONCAT44(0x28,in_stack_ffffffffffffffe8),(unsigned_long)in_RDX,
                  (int *)nelem);
        }
        else if (in_ESI == 0x29) {
          ffppnj((fitsfile *)group,unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (long *)CONCAT44(0x29,in_stack_ffffffffffffffe8),(long)in_RDX,(int *)nelem);
        }
        else if (in_ESI == 0x50) {
          ffppnujj((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                   CONCAT44(0x50,in_stack_ffffffffffffffe8),(LONGLONG)in_RDX,in_RCX,in_R8,
                   (int *)nulval);
        }
        else if (in_ESI == 0x51) {
          ffppnjj((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  CONCAT44(0x51,in_stack_ffffffffffffffe8),(LONGLONG)in_RDX,(LONGLONG *)in_RCX,in_R8
                  ,(int *)nulval);
        }
        else if (in_ESI == 0x2a) {
          ffppne((fitsfile *)group,unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (float *)CONCAT44(0x2a,in_stack_ffffffffffffffe8),nulval_00,(int *)in_RCX);
        }
        else if (in_ESI == 0x52) {
          ffppnd((fitsfile *)group,unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (double *)CONCAT44(0x52,in_stack_ffffffffffffffe8),in_RDX,(int *)in_RCX);
        }
        else {
          *(undefined4 *)group = 0x19a;
        }
      }
      iVar1 = *(int *)group;
    }
  }
  else {
    iVar1 = *(int *)group;
  }
  return iVar1;
}

Assistant:

int ffppn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

*/
{
    long group = 1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffppr(fptr, datatype, firstelem, nelem, array, status);
        return(*status);
    }

    if (datatype == TBYTE)
    {
      ffppnb(fptr, group, firstelem, nelem, (unsigned char *) array, 
             *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffppnsb(fptr, group, firstelem, nelem, (signed char *) array, 
             *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
      ffppnui(fptr, group, firstelem, nelem, (unsigned short *) array,
              *(unsigned short *) nulval,status);
    }
    else if (datatype == TSHORT)
    {
      ffppni(fptr, group, firstelem, nelem, (short *) array,
             *(short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffppnuk(fptr, group, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffppnk(fptr, group, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffppnuj(fptr, group, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval,status);
    }
    else if (datatype == TLONG)
    {
      ffppnj(fptr, group, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffppnujj(fptr, group, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffppnjj(fptr, group, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppne(fptr, group, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffppnd(fptr, group, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}